

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O0

string * __thiscall
Json::JsonParser::parseNumber_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  JsonException *pJVar6;
  char *__nptr;
  JsonParser *this_00;
  double d;
  char c_1;
  bool local_1a;
  char c;
  bool __negative;
  bool __unique;
  char prev_local;
  JsonParser *this_local;
  
  buffer_reset(this);
  local_1a = false;
  bVar1 = false;
  if (prev != '+') {
    if (prev == '-') {
      bVar1 = true;
    }
    else {
      if (prev != '.') {
        buffer_append(this,prev);
      }
      else {
        buffer_append(this,"0.");
      }
      local_1a = prev == '.';
    }
  }
  cVar2 = JsonReader::get(&this->__reader);
  if (local_1a) {
    JsonReader::back(&this->__reader);
  }
  else if (cVar2 == '.') {
    bVar3 = is_number(prev);
    if (!bVar3) {
      buffer_append(this,'0');
    }
    buffer_append(this,'.');
    local_1a = true;
  }
  else {
    cVar4 = buffer_back(this);
    if ((cVar4 == '0') && (bVar3 = is_number(cVar2), bVar3)) {
      JsonReader::back(&this->__reader);
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(pJVar6,&this->__reader);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
    if (((((prev == '+') && (cVar2 == '-')) || ((prev == '+' && (cVar2 == '+')))) ||
        ((prev == '-' && (cVar2 == '-')))) || ((prev == '-' && (cVar2 == '+')))) {
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(pJVar6,&this->__reader);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
    bVar3 = is_number(cVar2);
    if (bVar3) {
      buffer_append(this,cVar2);
    }
    else {
      JsonReader::back(&this->__reader);
    }
  }
  while( true ) {
    while( true ) {
      do {
        cVar2 = JsonReader::get(&this->__reader);
        bVar3 = is_space_char(cVar2);
      } while (bVar3);
      bVar3 = is_number(cVar2);
      if ((((!bVar3) && (cVar2 != '.')) && (cVar2 != 'e')) && (cVar2 != 'E')) break;
      if ((cVar2 == 'e') || (cVar2 == 'E')) {
        cVar4 = buffer_back(this);
        if (cVar4 == '.') {
          JsonReader::back(&this->__reader);
          pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar6,&this->__reader);
          __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
        }
        buffer_append(this,cVar2);
        cVar2 = JsonReader::get(&this->__reader);
        bVar3 = is_number(cVar2);
        if (((!bVar3) && (cVar2 != '+')) && (cVar2 != '-')) {
          pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar6,&this->__reader);
          __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
        }
        buffer_append(this,cVar2);
      }
      else if (cVar2 == '.') {
        if (local_1a) {
          pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(pJVar6,&this->__reader);
          __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
        }
        buffer_append(this,'.');
        local_1a = true;
      }
      else {
        iVar5 = buffer_size(this);
        if ((1 < iVar5) && (cVar4 = buffer_index(this,0), cVar4 == '0')) {
          cVar4 = buffer_index(this,1);
          bVar3 = is_number(cVar4);
          if (bVar3) {
            iVar5 = buffer_size(this);
            JsonReader::moveTo(&this->__reader,1 - iVar5);
            pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
            JsonException::JsonException(pJVar6,&this->__reader);
            __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
          }
        }
        buffer_append(this,cVar2);
      }
    }
    cVar4 = buffer_back(this);
    if (cVar4 == '.') {
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(pJVar6,&this->__reader);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
    if (((cVar2 == ',') || (cVar2 == '}')) || (cVar2 == ']')) break;
    bVar3 = is_space_char(cVar2);
    if (!bVar3) {
      pJVar6 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(pJVar6,&this->__reader);
      __cxa_throw(pJVar6,&JsonException::typeinfo,JsonException::~JsonException);
    }
  }
  JsonReader::back(&this->__reader);
  if (bVar1) {
    buffer_insert(this,'-',0);
  }
  __nptr = buffer_str(this);
  this_00 = (JsonParser *)0x0;
  d = strtod(__nptr,(char **)0x0);
  __num2str_abi_cxx11_(__return_storage_ptr__,this_00,d);
  return __return_storage_ptr__;
}

Assistant:

std::string Json::JsonParser::parseNumber(char prev) {
    buffer_reset();
    bool __unique = false, __negative = false;
    // -.1234 => -0.1234, .1234 => 0.1234
    if (prev == '+');
    else if (prev == '-')__negative = true;
    else if (prev == '.') {
        buffer_append("0.");
        __unique = true;
    } else buffer_append(prev);

    char c = __reader.get();
    if (!__unique) {  // +., -., 1.
        if (c == '.') {
            if (!is_number(prev)) buffer_append('0');
            buffer_append(c);
            __unique = true;
        } else if (buffer_back() == '0' && is_number(c)) {
            __reader.back();
            throw JsonException(__reader);
        } else if ((prev == '+' && c == '-') || (prev == '+' && c == '+')
                   || (prev == '-' && c == '-') || (prev == '-' && c == '+'))
            throw JsonException(__reader);
        else if (is_number(c))buffer_append(c);
        else __reader.back();
    } else __reader.back();

    for (;;) {
        char c = __reader.get();

        if (is_space_char(c)) continue;

        if (is_number(c) || c == '.' || c == 'e' || c == 'E') {
            // 1e+2, 1e-2, -1e2, .1e+2, 0.1e+2, -.1e+2, -e+2, -0e+2, .0e-3
            if (c == 'e' || c == 'E') {
                if (buffer_back() == '.') { // .E-3
                    __reader.back();
                    throw JsonException(__reader);
                }
                buffer_append(c);
                c = __reader.get();
                if (!(is_number(c) || c == '+' || c == '-')) throw JsonException(__reader);
                buffer_append(c);
            } else if (c == '.') {
                if (__unique) throw JsonException(__reader);
                buffer_append(c);
                __unique = true;
            } else {
                if (buffer_size() >= 2) {
                    if (buffer_index() == '0' && is_number(buffer_index(1))) {
                        __reader.moveTo(-(buffer_size() - 1));
                        throw JsonException(__reader);
                    }
                }
                buffer_append(c);
            }
        } else {
            if (buffer_back() == '.') throw JsonException(__reader);
            if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END)break;
            if (is_space_char(c))continue;
            else throw JsonException(__reader);
        }
    }
    __reader.back();
    if (__negative)
        buffer_insert('-');
    return __num2str(strtod((buffer_str()), nullptr));
}